

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O3

void __thiscall
webfront::http::
Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
::Connection(Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
             *this,Socket *sock,
            Connections<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
            *connectionsHandler,
            RequestHandler<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
            *handler)

{
  (this->onUpgrade).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->onUpgrade)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->onUpgrade).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->onUpgrade).super__Function_base._M_functor + 8) = 0;
  (this->
  super_enable_shared_from_this<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
  )._M_weak_this.
  super___weak_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->
  super_enable_shared_from_this<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
  )._M_weak_this.
  super___weak_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .service_ = (sock->super_basic_socket<std::experimental::net::v1::ip::tcp>).
              super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
              .service_;
  (this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.protocol_.family_ = 2;
  (this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.super_base_implementation_type.socket_ =
       (sock->super_basic_socket<std::experimental::net::v1::ip::tcp>).
       super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
       .implementation_.super_base_implementation_type.socket_;
  (sock->super_basic_socket<std::experimental::net::v1::ip::tcp>).
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.super_base_implementation_type.socket_ = -1;
  (this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.super_base_implementation_type.state_ =
       (sock->super_basic_socket<std::experimental::net::v1::ip::tcp>).
       super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
       .implementation_.super_base_implementation_type.state_;
  (sock->super_basic_socket<std::experimental::net::v1::ip::tcp>).
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.super_base_implementation_type.state_ = '\0';
  (this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.super_base_implementation_type.reactor_data_ =
       (sock->super_basic_socket<std::experimental::net::v1::ip::tcp>).
       super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
       .implementation_.super_base_implementation_type.reactor_data_;
  (sock->super_basic_socket<std::experimental::net::v1::ip::tcp>).
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.super_base_implementation_type.reactor_data_ = (per_descriptor_data)0x0;
  (this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.protocol_.family_ =
       (sock->super_basic_socket<std::experimental::net::v1::ip::tcp>).
       super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
       .implementation_.protocol_.family_;
  (sock->super_basic_socket<std::experimental::net::v1::ip::tcp>).
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.protocol_.family_ = 2;
  this->connections = connectionsHandler;
  this->requestHandler = handler;
  (this->request).super_Headers.headers.
  super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->request).super_Headers.headers.
  super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->request).super_Headers.headers.
  super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->request).uri._M_dataplus._M_p = (pointer)&(this->request).uri.field_2;
  (this->request).uri._M_string_length = 0;
  (this->request).uri.field_2._M_local_buf[0] = '\0';
  (this->request).state = methodStart;
  (this->response).super_Headers.headers.
  super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->response).super_Headers.headers.
  super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->response).super_Headers.headers.
  super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->response).content._M_dataplus._M_p = (pointer)&(this->response).content.field_2;
  (this->response).content._M_string_length = 0;
  (this->response).content.field_2._M_local_buf[0] = '\0';
  this->protocol = HTTP;
  if (log::logTypeEnabled._4_1_ == '\x01') {
    log::anon_unknown_4::log(0.0);
  }
  return;
}

Assistant:

explicit Connection(typename Net::Socket sock, Connections<Connection>& connectionsHandler,
                        RequestHandler<Net, FS>& handler)
        : socket(std::move(sock)), connections(connectionsHandler), requestHandler(handler) {
        log::debug("New connection");
    }